

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

usize __thiscall String::split(String *this,List<String> *tokens,char *separators,bool skipEmpty)

{
  char *this_00;
  usize uVar1;
  String local_f8;
  String local_d0;
  String local_a8;
  String local_70;
  long local_48;
  usize len;
  char *endStr;
  char *p;
  char *start;
  char *pcStack_20;
  bool skipEmpty_local;
  char *separators_local;
  List<String> *tokens_local;
  String *this_local;
  
  start._7_1_ = skipEmpty;
  pcStack_20 = separators;
  separators_local = (char *)tokens;
  tokens_local = (List<String> *)this;
  List<String>::clear(tokens);
  endStr = operator_cast_to_char_(this);
  p = endStr;
  while (len = (usize)strpbrk(endStr,pcStack_20), this_00 = separators_local,
        (char *)len != (char *)0x0) {
    local_48 = len - (long)endStr;
    if (local_48 == 0) {
      if ((start._7_1_ & 1) == 0) {
        String(&local_a8);
        List<String>::append((List<String> *)this_00,&local_a8);
        ~String(&local_a8);
      }
    }
    else {
      substr(&local_70,this,(long)endStr - (long)p,local_48);
      List<String>::append((List<String> *)this_00,&local_70);
      ~String(&local_70);
      endStr = (char *)len;
    }
    endStr = endStr + 1;
  }
  if (endStr < p + this->data->len) {
    substr(&local_d0,this,(long)endStr - (long)p,-1);
    List<String>::append((List<String> *)this_00,&local_d0);
    ~String(&local_d0);
  }
  else if ((start._7_1_ & 1) == 0) {
    String(&local_f8);
    List<String>::append((List<String> *)this_00,&local_f8);
    ~String(&local_f8);
  }
  uVar1 = List<String>::size((List<String> *)separators_local);
  return uVar1;
}

Assistant:

usize String::split(List<String>& tokens, const char* separators, bool skipEmpty) const
{
  tokens.clear();

  const char* start = *this;
  const char* p = start, * endStr;
  for(;;)
  {
    endStr = strpbrk(p, separators);
    if(endStr)
    {
      usize len = endStr - p;
      if(len)
      {
        tokens.append(substr(p - start, len));
        p = endStr + 1;
      }
      else
      {
        if(!skipEmpty)
          tokens.append(String());
        ++p;
      }
    }
    else
    {
      if(p < start + data->len)
        tokens.append(substr(p - start));
      else if(!skipEmpty)
        tokens.append(String());
      break;
    }
  }
  return tokens.size();
}